

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O2

QByteArray *
QtStringBuilder::appendToByteArray<QStringBuilder<char_const(&)[13],QByteArray&>,char>
          (QByteArray *a,QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_char> *b,
          char param_3)

{
  Data *pDVar1;
  qsizetype qVar2;
  long asize;
  long lVar3;
  long in_FS_OFFSET;
  char *it;
  char *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = (a->d).size + (((b->a).b)->d).size + 0xd;
  QByteArray::detach(a);
  qVar2 = QArrayDataPointer<char>::freeSpaceAtEnd(&a->d);
  if (qVar2 < lVar3) {
    pDVar1 = (a->d).d;
    if (pDVar1 == (Data *)0x0) {
      asize = 0;
    }
    else {
      asize = (pDVar1->super_QArrayData).alloc * 2;
    }
    if (asize < lVar3) {
      asize = lVar3;
    }
    QByteArray::reserve(a,asize);
  }
  local_28 = QByteArray::data(a);
  local_28 = local_28 + (a->d).size;
  QConcatenable<QStringBuilder<QStringBuilder<const_char_(&)[13],_QByteArray_&>,_char>_>::
  appendTo<char>(b,&local_28);
  QByteArray::resize((longlong)a);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return a;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray &appendToByteArray(QByteArray &a, const QStringBuilder<A, B> &b, char)
{
    // append 8-bit data to a byte array
    qsizetype len = a.size() + QConcatenable< QStringBuilder<A, B> >::size(b);
    a.detach(); // a detach() in a.data() could reset a.capacity() to a.size()
    if (len > a.data_ptr().freeSpaceAtEnd()) // capacity() was broken when prepend()-optimization landed
        a.reserve(qMax(len, 2 * a.capacity()));
    char *it = a.data() + a.size();
    QConcatenable< QStringBuilder<A, B> >::appendTo(b, it);
    a.resize(len); //we need to resize after the appendTo for the case str+=foo+str
    return a;
}